

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O1

bool __thiscall QTableModel::insertRows(QTableModel *this,int row,int count,QModelIndex *param_3)

{
  QList<QTableWidgetItem_*> *this_00;
  qsizetype qVar1;
  qsizetype qVar2;
  bool bVar3;
  int iVar4;
  ulong i;
  long in_FS_OFFSET;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (-1 < row && 0 < count) {
    i = (ulong)(uint)row;
    if (i <= (ulong)(this->verticalHeaderItems).d.size) {
      local_50 = 0xffffffffffffffff;
      local_48 = 0;
      uStack_40 = 0;
      QAbstractItemModel::beginInsertRows((QModelIndex *)this,(int)&local_50,row);
      qVar1 = (this->verticalHeaderItems).d.size;
      qVar2 = (this->horizontalHeaderItems).d.size;
      if (count != 0) {
        QtPrivate::QPodArrayOps<QTableWidgetItem_*>::insert
                  ((QPodArrayOps<QTableWidgetItem_*> *)&this->verticalHeaderItems,i,
                   (ulong)(uint)count,(parameter_type)0x0);
      }
      QList<QTableWidgetItem_*>::begin(&this->verticalHeaderItems);
      this_00 = &this->tableItems;
      iVar4 = (int)qVar2 * count;
      if ((int)qVar1 == 0) {
        QList<QTableWidgetItem_*>::resize(this_00,(long)iVar4);
      }
      else {
        if (iVar4 != 0) {
          QtPrivate::QPodArrayOps<QTableWidgetItem_*>::insert
                    ((QPodArrayOps<QTableWidgetItem_*> *)this_00,
                     i * (this->horizontalHeaderItems).d.size,(long)iVar4,(parameter_type)0x0);
        }
        QList<QTableWidgetItem_*>::begin(this_00);
      }
      QAbstractItemModel::endInsertRows();
      bVar3 = true;
      goto LAB_0059ca92;
    }
  }
  bVar3 = false;
LAB_0059ca92:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QTableModel::insertRows(int row, int count, const QModelIndex &)
{
    if (count < 1 || row < 0 || row > verticalHeaderItems.size())
        return false;

    beginInsertRows(QModelIndex(), row, row + count - 1);
    int rc = verticalHeaderItems.size();
    int cc = horizontalHeaderItems.size();
    verticalHeaderItems.insert(row, count, 0);
    if (rc == 0)
        tableItems.resize(cc * count);
    else
        tableItems.insert(tableIndex(row, 0), cc * count, 0);
    endInsertRows();
    return true;
}